

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkImplItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs)

{
  _Rb_tree_color _Var1;
  size_t sVar2;
  cmake *pcVar3;
  pointer pLVar4;
  cmLocalGenerator *pcVar5;
  _Base_ptr p_Var6;
  cmGeneratorTarget *this_00;
  pointer pLVar7;
  cmLocalGenerator *pcVar8;
  pointer pcVar9;
  iterator iVar10;
  _Base_ptr p_Var11;
  bool bVar12;
  _Alloc_hider _Var13;
  undefined1 auVar14 [8];
  bool bVar15;
  int iVar16;
  TargetType TVar17;
  string *psVar18;
  string *psVar19;
  pair<int,_bool> pVar20;
  const_iterator cVar21;
  long lVar22;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var23;
  _Rb_tree_node_base *p_Var24;
  pointer pLVar25;
  ulong uVar26;
  pointer this_01;
  cmMakefile *pcVar27;
  _Rb_tree_color _Var28;
  cmGlobalGenerator *pcVar29;
  cmMakefile *pcVar30;
  _Alloc_hider _Var31;
  undefined1 *puVar32;
  char cVar33;
  bool bVar34;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  int dependee_index;
  pair<int,_bool> groupIndex;
  vector<int,_std::allocator<int>_> indexes;
  string feature;
  vector<int,_std::allocator<int>_> groupItems;
  int index;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  _Rb_tree_color local_288;
  _Rb_tree_color local_284;
  char local_280;
  char local_279;
  pointer local_278;
  uint local_26c;
  undefined1 local_268 [48];
  undefined1 local_238 [24];
  cmGlobalGenerator *local_220;
  _Alloc_hider local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  cmLocalGenerator *local_1f8;
  cmGlobalGenerator *local_1f0;
  _Base_ptr local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  _Base_ptr local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  cmLocalGenerator *local_1c8;
  _Alloc_hider local_1c0;
  size_type local_1b8;
  char *local_1b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  undefined1 *local_198;
  _Base_ptr local_190;
  cmLocalGenerator *local_188;
  cmGlobalGenerator *local_180;
  size_t local_178;
  char *local_170;
  cmGlobalGenerator *local_160;
  string local_158;
  ulong local_138;
  _Rb_tree_node_base *local_130;
  _Alloc_hider local_128;
  undefined1 local_120 [8];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  cmake *local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  cmake *local_80;
  _Alloc_hider local_78;
  cmMakefile *local_70;
  undefined1 local_68 [16];
  _Rb_tree_node_base local_58;
  _Base_ptr local_38;
  
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = (_Base_ptr)0x0;
  local_128._M_p = local_118;
  local_26c = depender_index;
  local_58._M_right = local_58._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
             LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p +
             LinkEntry::DEFAULT_abi_cxx11_._M_string_length);
  local_284 = ~_S_red;
  local_280 = '\0';
  local_108._0_8_ = (_Base_ptr)0x0;
  local_108._8_8_ = (_Base_ptr)0x0;
  local_f8 = (undefined1  [8])0x0;
  this_01 = (libs->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_68._0_8_ =
       (libs->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  p_Var24 = local_58._M_left;
  if (this_01 != (pointer)local_68._0_8_) {
    local_138 = (ulong)local_26c;
    local_a0 = (cmake *)&this->LinkLanguage;
    local_98 = (_Base_ptr)&this->OriginalEntries;
    local_88 = (_Base_ptr)&this->GroupItems;
    local_70 = (cmMakefile *)&this->LinkLibraryOverride;
    local_90 = &(this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_130 = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar12 = false;
    do {
      local_278 = this_01;
      psVar18 = cmLinkItem::AsStr_abi_cxx11_(&this_01->super_cmLinkItem);
      psVar19 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      sVar2 = psVar18->_M_string_length;
      if (((sVar2 == psVar19->_M_string_length) &&
          ((sVar2 == 0 ||
           (iVar16 = bcmp((psVar18->_M_dataplus)._M_p,(psVar19->_M_dataplus)._M_p,sVar2),
           iVar16 == 0)))) ||
         (psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem),
         psVar18->_M_string_length == 0)) goto LAB_004e495d;
      psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
      local_238._8_8_ = (psVar18->_M_dataplus)._M_p;
      local_238._0_8_ = psVar18->_M_string_length;
      __str._M_str = (char *)DAT_008e5e80;
      __str._M_len = (size_t)(anonymous_namespace)::LL_BEGIN;
      iVar16 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_238,0,
                          (size_type)(anonymous_namespace)::LL_BEGIN,__str);
      if (iVar16 == 0) {
        psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
        if ((psVar18->_M_string_length == 0) ||
           ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] != '>')) goto LAB_004e3506;
        psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
        std::__cxx11::string::find((char)psVar18,0x3e);
        std::__cxx11::string::substr((ulong)local_238,(ulong)psVar18);
        std::__cxx11::string::operator=((string *)&local_128,(string *)local_238);
        if ((cmMakefile *)local_238._0_8_ != (cmMakefile *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,(ulong)((long)(_func_int ***)local_238._16_8_ + 1)
                         );
        }
        uVar26 = local_138;
        if ((int)local_26c < 0) goto LAB_004e495d;
        pLVar25 = (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this_00 = pLVar25[local_138].Target;
        if (((this_00 == (cmGeneratorTarget *)0x0) ||
            (bVar15 = cmGeneratorTarget::IsImported(this_00), !bVar15)) ||
           (bVar15 = anon_unknown.dwarf_20035e2::IsFeatureSupported
                               (this->Makefile,(string *)local_a0,(string *)&local_128), bVar15))
        goto LAB_004e495d;
        pcVar3 = this->CMakeInstance;
        psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar25[uVar26].Target);
        local_220 = (cmGlobalGenerator *)(psVar18->_M_dataplus)._M_p;
        local_238._16_8_ = psVar18->_M_string_length;
        local_238._0_8_ = (cmMakefile *)0x17;
        local_238._8_8_ = "The \'IMPORTED\' target \'";
        local_218._M_p = &DAT_00000044;
        local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x730b5f;
        local_208._M_allocated_capacity = (size_type)local_120;
        local_208._8_8_ = local_128._M_p;
        local_1f8 = (cmLocalGenerator *)0x5c;
        local_1f0 = (cmGlobalGenerator *)0x730ba4;
        local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(this->LinkLanguage)._M_dataplus._M_p;
        local_1e8 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
        local_1d8 = (_Base_ptr)&DAT_00000014;
        local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x71d2b7;
        local_1c8 = (cmLocalGenerator *)local_120;
        local_1c0._M_p = local_128._M_p;
        local_1b8 = 0xd;
        local_1b0[0] = "\" and \"CMAKE_";
        local_198 = &DAT_00000014;
        local_190 = (_Base_ptr)0x71d2b7;
        local_188 = (cmLocalGenerator *)local_120;
        local_180 = (cmGlobalGenerator *)local_128._M_p;
        local_178 = 0xc;
        local_170 = "_SUPPORTED\"?";
        views_06._M_len = 0xd;
        views_06._M_array = (iterator)local_238;
        local_1b0[1] = (char *)local_1e8;
        local_1a0 = local_1e0;
        cmCatViews_abi_cxx11_((string *)local_268,views_06);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_238);
        cmake::IssueMessage(pcVar3,AUTHOR_ERROR,(string *)local_268,(cmListFileBacktrace *)local_238
                           );
        if ((cmMakefile *)local_238._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
        }
        if ((cmMakefile *)local_268._0_8_ == (cmMakefile *)(local_268 + 0x10)) goto LAB_004e495d;
        uVar26 = CONCAT71(local_268._17_7_,local_268[0x10]) + 1;
        pcVar27 = (cmMakefile *)local_268._0_8_;
LAB_004e492f:
        operator_delete(pcVar27,uVar26);
      }
      else {
LAB_004e3506:
        psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
        local_238._8_8_ = (psVar18->_M_dataplus)._M_p;
        local_238._0_8_ = psVar18->_M_string_length;
        __str_00._M_str = DAT_008e5e90;
        __str_00._M_len = (anonymous_namespace)::LL_END;
        iVar16 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_238,0,
                            (anonymous_namespace)::LL_END,__str_00);
        if (iVar16 == 0) {
          psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
          if ((psVar18->_M_string_length == 0) ||
             ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] != '>')) goto LAB_004e3546;
          std::__cxx11::string::_M_assign((string *)&local_128);
        }
        else {
LAB_004e3546:
          psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
          local_238._8_8_ = (psVar18->_M_dataplus)._M_p;
          local_238._0_8_ = psVar18->_M_string_length;
          __str_01._M_str = (char *)DAT_008e5ea0;
          __str_01._M_len = (size_t)(anonymous_namespace)::LG_BEGIN;
          iVar16 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_238,0,
                              (size_type)(anonymous_namespace)::LG_BEGIN,__str_01);
          if (iVar16 == 0) {
            psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
            if ((psVar18->_M_string_length != 0) &&
               ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] == '>')) {
              pVar20 = AddLinkEntry(this,&local_278->super_cmLinkItem,-1);
              _Var28 = pVar20.first;
              local_280 = pVar20.second;
              local_284 = _Var28;
              if (((ulong)pVar20 >> 0x20 & 1) != 0) {
                pLVar25 = (this->EntryList).
                          super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
                std::__cxx11::string::find((char)psVar18,0x3a);
                std::__cxx11::string::substr((ulong)local_238,(ulong)psVar18);
                std::__cxx11::string::operator=
                          ((string *)&pLVar25[(int)_Var28].Feature,(string *)local_238);
                if ((cmMakefile *)local_238._0_8_ != (cmMakefile *)(local_238 + 0x10)) {
                  operator_delete((void *)local_238._0_8_,
                                  (ulong)((long)(_func_int ***)local_238._16_8_ + 1));
                }
              }
              if ((int)local_26c < 0) {
                iVar10._M_current =
                     (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  bVar12 = true;
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_98,iVar10,(int *)&local_284);
                  goto LAB_004e495d;
                }
                *iVar10._M_current = local_284;
                (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar10._M_current + 1;
              }
              else {
                pcVar9 = (this->EntryConstraintGraph).
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                         super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
                local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
                local_238._0_8_ = (cmMakefile *)0x0;
                local_238._8_8_ = (cmMakefile *)0x0;
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                          ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238);
                std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
                emplace_back<int&,bool,bool,cmListFileBacktrace>
                          ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar9 + local_138),
                           (int *)&local_284,(bool *)local_268,(bool *)local_d0._M_local_buf,
                           (cmListFileBacktrace *)local_238);
                if ((cmMakefile *)local_238._8_8_ != (cmMakefile *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
                }
              }
              bVar12 = true;
              goto LAB_004e495d;
            }
          }
          psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
          local_238._8_8_ = (psVar18->_M_dataplus)._M_p;
          local_238._0_8_ = psVar18->_M_string_length;
          __str_02._M_str = DAT_008e5eb0;
          __str_02._M_len = (anonymous_namespace)::LG_END;
          iVar16 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_238,0,
                              (anonymous_namespace)::LG_END,__str_02);
          if (iVar16 == 0) {
            psVar18 = cmLinkItem::AsStr_abi_cxx11_(&local_278->super_cmLinkItem);
            if ((psVar18->_M_string_length != 0) &&
               ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] == '>')) {
              local_288 = local_284;
              if (local_280 == '\x01') {
                std::
                _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                ::_M_emplace_unique<int&,std::vector<int,std::allocator<int>>&>
                          ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                            *)local_88,(int *)&local_284,
                           (vector<int,_std::allocator<int>_> *)local_108);
              }
              local_284 = ~_S_red;
              local_280 = '\0';
              if (local_108._8_8_ != local_108._0_8_) {
                local_108._8_8_ = local_108._0_8_;
              }
              bVar12 = false;
              goto LAB_004e495d;
            }
          }
          uVar26 = local_138;
          _Var28 = local_284;
          if ((-1 < (int)local_26c) && (bVar12)) {
            pLVar25 = (this->EntryList).
                      super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pLVar25[local_138].Target != (cmGeneratorTarget *)0x0) {
              bVar15 = cmGeneratorTarget::IsImported(pLVar25[local_138].Target);
              if (bVar15) {
                psVar18 = &pLVar25[(int)_Var28].Feature;
                bVar15 = anon_unknown.dwarf_20035e2::IsGroupFeatureSupported
                                   (this->Makefile,(string *)local_a0,psVar18);
                if (!bVar15) {
                  pcVar3 = this->CMakeInstance;
                  psVar19 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar25[uVar26].Target);
                  local_220 = (cmGlobalGenerator *)(psVar19->_M_dataplus)._M_p;
                  local_238._16_8_ = psVar19->_M_string_length;
                  local_238._0_8_ = (cmMakefile *)0x17;
                  local_238._8_8_ = "The \'IMPORTED\' target \'";
                  local_218._M_p = &DAT_00000042;
                  local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x730c1c;
                  local_208._8_8_ = (psVar18->_M_dataplus)._M_p;
                  local_208._M_allocated_capacity = pLVar25[(int)_Var28].Feature._M_string_length;
                  local_1f8 = (cmLocalGenerator *)0x5c;
                  local_1f0 = (cmGlobalGenerator *)0x730ba4;
                  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(this->LinkLanguage)._M_dataplus._M_p;
                  local_1e8 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
                  local_1d8 = (_Base_ptr)0x12;
                  local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x71d580;
                  local_1c0._M_p = (psVar18->_M_dataplus)._M_p;
                  local_1c8 = (cmLocalGenerator *)pLVar25[(int)_Var28].Feature._M_string_length;
                  local_1b8 = 0xd;
                  local_1b0[0] = "\" and \"CMAKE_";
                  local_198 = (undefined1 *)0x12;
                  local_190 = (_Base_ptr)0x71d580;
                  local_180 = (cmGlobalGenerator *)(psVar18->_M_dataplus)._M_p;
                  local_188 = (cmLocalGenerator *)pLVar25[(int)_Var28].Feature._M_string_length;
                  local_178 = 0xc;
                  local_170 = "_SUPPORTED\"?";
                  views._M_len = 0xd;
                  views._M_array = (iterator)local_238;
                  local_1b0[1] = (char *)local_1e8;
                  local_1a0 = local_1e0;
                  cmCatViews_abi_cxx11_((string *)local_268,views);
                  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_238);
                  cmake::IssueMessage(pcVar3,AUTHOR_ERROR,(string *)local_268,
                                      (cmListFileBacktrace *)local_238);
                  if ((cmMakefile *)local_238._8_8_ != (cmMakefile *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
                  }
                  if ((cmMakefile *)local_268._0_8_ != (cmMakefile *)(local_268 + 0x10)) {
                    operator_delete((void *)local_268._0_8_,
                                    CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
                  }
                }
              }
            }
          }
          pVar20 = AddLinkEntry(this,&local_278->super_cmLinkItem,local_284);
          local_288 = pVar20.first;
          pLVar25 = (this->EntryList).
                    super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start + (int)local_288;
          cVar21 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_70,(key_type *)pLVar25);
          _Var31._M_p = (pointer)(cVar21._M_node + 2);
          if (cVar21._M_node == local_90) {
            _Var31._M_p = (pointer)&local_128;
          }
          cVar33 = ((ulong)pVar20 & 0x100000000) == 0;
          if ((((bVar12) && (((ulong)pVar20 & 0x100000000) != 0)) &&
              (pLVar25->Target != (cmGeneratorTarget *)0x0)) &&
             ((TVar17 = cmGeneratorTarget::GetType(pLVar25->Target), TVar17 == OBJECT_LIBRARY ||
              (TVar17 = cmGeneratorTarget::GetType(pLVar25->Target), TVar17 == INTERFACE_LIBRARY))))
          {
            lVar22 = (long)(int)local_284;
            local_80 = this->CMakeInstance;
            pLVar4 = (this->EntryList).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_160 = (cmGlobalGenerator *)pLVar4[lVar22].Feature._M_dataplus._M_p;
            pcVar5 = (cmLocalGenerator *)pLVar4[lVar22].Feature._M_string_length;
            local_279 = cVar33;
            local_78._M_p = _Var31._M_p;
            TVar17 = cmGeneratorTarget::GetType(pLVar25->Target);
            local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x720cee;
            if (TVar17 == OBJECT_LIBRARY) {
              local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x719103;
            }
            local_238._0_8_ = (cmMakefile *)0xd;
            local_238._8_8_ = "The feature \'";
            local_220 = local_160;
            local_218._M_p = (pointer)0x31;
            local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x730c6d;
            local_208._M_allocated_capacity = (size_type)(anonymous_namespace)::LG_BEGIN;
            local_208._8_8_ = DAT_008e5ea0;
            local_1f0 = (cmGlobalGenerator *)pLVar4[lVar22].Feature._M_dataplus._M_p;
            local_1f8 = (cmLocalGenerator *)pLVar4[lVar22].Feature._M_string_length;
            local_1e8 = (_Base_ptr)0x1f;
            local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x730c9f;
            local_1d8 = (_Base_ptr)((ulong)(TVar17 != OBJECT_LIBRARY) * 3 + 6);
            local_1c8 = (cmLocalGenerator *)0xa;
            local_1c0._M_p = " library \'";
            local_1b0[0] = (pLVar25->Item).Value._M_dataplus._M_p;
            local_1b8 = (pLVar25->Item).Value._M_string_length;
            local_1b0[1] = &DAT_00000002;
            local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x6fc947;
            views_00._M_len = 10;
            views_00._M_array = (iterator)local_238;
            local_238._16_8_ = pcVar5;
            cmCatViews_abi_cxx11_((string *)local_268,views_00);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_238);
            cmake::IssueMessage(local_80,AUTHOR_WARNING,(string *)local_268,
                                (cmListFileBacktrace *)local_238);
            _Var31._M_p = local_78._M_p;
            cVar33 = local_279;
            if ((cmMakefile *)local_238._8_8_ != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
            }
            if ((cmMakefile *)local_268._0_8_ != (cmMakefile *)(local_268 + 0x10)) {
              operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1
                             );
            }
          }
          pcVar29 = (cmGlobalGenerator *)&cVar21._M_node[2]._M_parent;
          if (cVar21._M_node == local_90) {
            pcVar29 = (cmGlobalGenerator *)local_120;
          }
          p_Var6 = (_Base_ptr)pcVar29->_vptr_cmGlobalGenerator;
          if (p_Var6 == (_Base_ptr)LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
            if (p_Var6 != (_Base_ptr)0x0) {
              iVar16 = bcmp(*(void **)_Var31._M_p,LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                            (size_t)p_Var6);
              cVar33 = iVar16 == 0 || ((ulong)pVar20 >> 0x20 & 1) == 0;
              goto LAB_004e3ad5;
            }
          }
          else {
LAB_004e3ad5:
            if (cVar33 == '\0') {
              if ((pLVar25->Target == (cmGeneratorTarget *)0x0) ||
                 ((TVar17 = cmGeneratorTarget::GetType(pLVar25->Target), TVar17 != OBJECT_LIBRARY &&
                  (TVar17 = cmGeneratorTarget::GetType(pLVar25->Target), TVar17 != INTERFACE_LIBRARY
                  )))) {
                std::__cxx11::string::_M_assign((string *)&pLVar25->Feature);
              }
              else {
                auVar14 = local_120;
                _Var13._M_p = local_128._M_p;
                pcVar3 = this->CMakeInstance;
                local_160 = pcVar29;
                TVar17 = cmGeneratorTarget::GetType(pLVar25->Target);
                local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x720cee;
                if (TVar17 == OBJECT_LIBRARY) {
                  local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x719103;
                }
                local_238._0_8_ = (cmMakefile *)0xd;
                local_238._8_8_ = "The feature \'";
                local_238._16_8_ = auVar14;
                local_220 = (cmGlobalGenerator *)_Var13._M_p;
                local_218._M_p = (pointer)0x31;
                local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x730c6d;
                local_208._M_allocated_capacity = (size_type)(anonymous_namespace)::LL_BEGIN;
                local_208._8_8_ = DAT_008e5e80;
                local_1f8 = (cmLocalGenerator *)local_120;
                local_1f0 = (cmGlobalGenerator *)local_128._M_p;
                local_1e8 = (_Base_ptr)0x1f;
                local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x730c9f;
                local_1d8 = (_Base_ptr)((ulong)(TVar17 != OBJECT_LIBRARY) * 3 + 6);
                local_1c8 = (cmLocalGenerator *)0xa;
                local_1c0._M_p = " library \'";
                local_1b0[0] = (pLVar25->Item).Value._M_dataplus._M_p;
                local_1b8 = (pLVar25->Item).Value._M_string_length;
                local_1b0[1] = &DAT_00000002;
                local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x6fc947;
                views_01._M_len = 10;
                views_01._M_array = (iterator)local_238;
                cmCatViews_abi_cxx11_((string *)local_268,views_01);
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_238);
                cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_268,
                                    (cmListFileBacktrace *)local_238);
                pcVar29 = local_160;
                if ((cmMakefile *)local_238._8_8_ != (cmMakefile *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
                }
                if ((cmMakefile *)local_268._0_8_ != (cmMakefile *)(local_268 + 0x10)) {
                  operator_delete((void *)local_268._0_8_,
                                  CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
                }
              }
            }
          }
          if ((pLVar25->Target == (cmGeneratorTarget *)0x0) ||
             ((TVar17 = cmGeneratorTarget::GetType(pLVar25->Target), TVar17 != OBJECT_LIBRARY &&
              (TVar17 = cmGeneratorTarget::GetType(pLVar25->Target), TVar17 != INTERFACE_LIBRARY))))
          {
            _Var28 = local_284;
            if ((bVar12) &&
               (p_Var24 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               p_Var24 != local_130)) {
              pLVar4 = (this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar22 = (long)(int)local_284;
              do {
                _Var1 = p_Var24[1]._M_color;
                pLVar7 = (this->EntryList).
                         super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                sVar2 = pLVar7[(int)_Var1].Feature._M_string_length;
                if (((sVar2 != pLVar4[(int)_Var28].Feature._M_string_length) ||
                    ((sVar2 != 0 &&
                     (iVar16 = bcmp(pLVar7[(int)_Var1].Feature._M_dataplus._M_p,
                                    pLVar4[lVar22].Feature._M_dataplus._M_p,sVar2), iVar16 != 0))))
                   && (_Var23 = std::
                                __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                          (p_Var24[1]._M_parent,p_Var24[1]._M_left,&local_288),
                      (_Base_ptr)_Var23._M_current != p_Var24[1]._M_left)) {
                  pcVar3 = this->CMakeInstance;
                  psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
                  local_220 = (cmGlobalGenerator *)(psVar18->_M_dataplus)._M_p;
                  local_238._16_8_ = psVar18->_M_string_length;
                  local_238._0_8_ = (cmMakefile *)0x1b;
                  local_238._8_8_ = "Impossible to link target \'";
                  local_218._M_p = (pointer)0x19;
                  local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x730ce6;
                  local_208._8_8_ = (pLVar25->Item).Value._M_dataplus._M_p;
                  local_208._M_allocated_capacity = (pLVar25->Item).Value._M_string_length;
                  local_1f8 = (cmLocalGenerator *)0x25;
                  local_1f0 = (cmGlobalGenerator *)0x730d00;
                  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)pLVar4[lVar22].Feature._M_dataplus._M_p;
                  local_1e8 = (_Base_ptr)pLVar4[(int)_Var28].Feature._M_string_length;
                  local_268._0_8_ = &DAT_00000001;
                  local_268._8_8_ = local_268 + 0x10;
                  local_268[0x10] = '\'';
                  local_1d8 = (_Base_ptr)&DAT_00000001;
                  local_1c8 = (cmLocalGenerator *)0x29;
                  local_1c0._M_p = ", has already occurred with the feature \'";
                  local_1b0[0] = pLVar7[(int)_Var1].Feature._M_dataplus._M_p;
                  local_1b8 = pLVar7[(int)_Var1].Feature._M_string_length;
                  local_d0._0_8_ = &DAT_00000001;
                  local_1a0 = local_c0;
                  local_c0[0]._M_local_buf[0] = '\'';
                  local_1b0[1] = &DAT_00000001;
                  local_198 = (undefined1 *)0x17;
                  local_190 = (_Base_ptr)0x730d50;
                  views_02._M_len = 0xb;
                  views_02._M_array = (iterator)local_238;
                  local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
                  local_d0._8_8_ = local_1a0;
                  cmCatViews_abi_cxx11_(&local_158,views_02);
                  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_238);
                  cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_158,(cmListFileBacktrace *)local_238
                                     );
                  if ((cmMakefile *)local_238._8_8_ != (cmMakefile *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                }
                p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
              } while (p_Var24 != local_130);
            }
            p_Var6 = (_Base_ptr)(pLVar25->Feature)._M_string_length;
            if ((p_Var6 != (_Base_ptr)pcVar29->_vptr_cmGlobalGenerator) ||
               ((p_Var6 != (_Base_ptr)0x0 &&
                (iVar16 = bcmp((pLVar25->Feature)._M_dataplus._M_p,*(void **)_Var31._M_p,
                               (size_t)p_Var6), iVar16 != 0)))) {
              pcVar3 = this->CMakeInstance;
              psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
              local_160 = (cmGlobalGenerator *)(psVar18->_M_dataplus)._M_p;
              pcVar5 = (cmLocalGenerator *)psVar18->_M_string_length;
              pcVar8 = (cmLocalGenerator *)pcVar29->_vptr_cmGlobalGenerator;
              if ((pcVar8 == (cmLocalGenerator *)LinkEntry::DEFAULT_abi_cxx11_._M_string_length) &&
                 ((pcVar8 == (cmLocalGenerator *)0x0 ||
                  (iVar16 = bcmp(*(void **)_Var31._M_p,
                                 LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,(size_t)pcVar8),
                  iVar16 == 0)))) {
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_158,"without any feature or \'DEFAULT\' feature","");
              }
              else {
                local_220 = *(cmGlobalGenerator **)_Var31._M_p;
                local_238._0_8_ = (cmMakefile *)0x12;
                local_238._8_8_ = "with the feature \'";
                local_268._0_8_ = &DAT_00000001;
                local_268._8_8_ = local_268 + 0x10;
                local_268[0x10] = '\'';
                local_218._M_p = &DAT_00000001;
                views_03._M_len = 3;
                views_03._M_array = (iterator)local_238;
                local_238._16_8_ = pcVar8;
                local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
                cmCatViews_abi_cxx11_(&local_158,views_03);
              }
              pcVar8 = (cmLocalGenerator *)(pLVar25->Feature)._M_string_length;
              if ((pcVar8 == (cmLocalGenerator *)LinkEntry::DEFAULT_abi_cxx11_._M_string_length) &&
                 ((pcVar8 == (cmLocalGenerator *)0x0 ||
                  (iVar16 = bcmp((pLVar25->Feature)._M_dataplus._M_p,
                                 LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,(size_t)pcVar8),
                  iVar16 == 0)))) {
                local_f0._0_8_ = local_f0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_f0,"without any feature or \'DEFAULT\' feature","");
              }
              else {
                local_220 = (cmGlobalGenerator *)(pLVar25->Feature)._M_dataplus._M_p;
                local_238._0_8_ = (element_type *)0x12;
                local_238._8_8_ = "with the feature \'";
                local_268._0_8_ = &DAT_00000001;
                local_268._8_8_ = local_268 + 0x10;
                local_268[0x10] = '\'';
                local_218._M_p = &DAT_00000001;
                views_04._M_len = 3;
                views_04._M_array = (iterator)local_238;
                local_238._16_8_ = pcVar8;
                local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
                cmCatViews_abi_cxx11_((string *)local_f0,views_04);
              }
              local_238._0_8_ = (cmMakefile *)0x1b;
              local_238._8_8_ = "Impossible to link target \'";
              local_220 = local_160;
              local_218._M_p = (pointer)0x19;
              local_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x730ce6;
              local_208._8_8_ = (pLVar25->Item).Value._M_dataplus._M_p;
              local_208._M_allocated_capacity = (pLVar25->Item).Value._M_string_length;
              local_1f8 = (cmLocalGenerator *)0xd;
              local_1f0 = (cmGlobalGenerator *)0x730d68;
              local_1e8 = (_Base_ptr)local_158._M_string_length;
              local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p;
              local_1d8 = (_Base_ptr)0x17;
              local_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x730d9f;
              local_1c8 = (cmLocalGenerator *)local_f0._8_8_;
              local_1c0._M_p = (pointer)local_f0._0_8_;
              local_1b8 = 0x17;
              local_1b0[0] = ", which is not allowed.";
              views_05._M_len = 9;
              views_05._M_array = (iterator)local_238;
              local_238._16_8_ = pcVar5;
              cmCatViews_abi_cxx11_((string *)&local_d0,views_05);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_238);
              cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)&local_d0,
                                  (cmListFileBacktrace *)local_238);
              if ((cmMakefile *)local_238._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._0_8_ != local_c0) {
                operator_delete((void *)local_d0._0_8_,
                                CONCAT71(local_c0[0]._M_allocated_capacity._1_7_,
                                         local_c0[0]._M_local_buf[0]) + 1);
              }
              if ((cmGlobalGenerator *)local_f0._0_8_ != (cmGlobalGenerator *)(local_f0 + 0x10)) {
                operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
            }
          }
          if (bVar12) {
            if ((undefined1  [8])local_108._8_8_ == local_f8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_108,(iterator)local_108._8_8_,
                         (int *)&local_288);
            }
            else {
              *(_Rb_tree_color *)local_108._8_8_ = local_288;
              local_108._8_8_ = local_108._8_8_ + 4;
            }
          }
          else {
            local_238._0_8_ = (cmMakefile *)0x0;
            local_238._8_8_ = (cmMakefile *)0x0;
            local_238._16_8_ = (cmLocalGenerator *)0x0;
            p_Var24 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (p_Var24 == local_130) {
LAB_004e4766:
              if (local_238._8_8_ == local_238._16_8_) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_238,(iterator)local_238._8_8_,
                           (int *)&local_288);
                pcVar30 = (cmMakefile *)local_238._0_8_;
                pcVar27 = (cmMakefile *)local_238._8_8_;
              }
              else {
                *(_Rb_tree_color *)local_238._8_8_ = local_288;
                local_238._8_8_ = local_238._8_8_ + 4;
                pcVar30 = (cmMakefile *)local_238._0_8_;
                pcVar27 = (cmMakefile *)local_238._8_8_;
              }
            }
            else {
              bVar15 = false;
              do {
                p_Var6 = p_Var24[1]._M_left;
                if (p_Var24[1]._M_parent != p_Var6) {
                  p_Var11 = p_Var24[1]._M_parent;
                  do {
                    puVar32 = &p_Var11->field_0x4;
                    pLVar4 = (this->EntryList).
                             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    sVar2 = (pLVar25->Item).Value._M_string_length;
                    if (sVar2 == pLVar4[(int)p_Var11->_M_color].Item.Value._M_string_length) {
                      if (sVar2 == 0) {
                        bVar34 = true;
                      }
                      else {
                        iVar16 = bcmp((pLVar25->Item).Value._M_dataplus._M_p,
                                      pLVar4[(int)p_Var11->_M_color].Item.Value._M_dataplus._M_p,
                                      sVar2);
                        bVar34 = iVar16 == 0;
                      }
                    }
                    else {
                      bVar34 = false;
                    }
                    if (bVar34) {
                      if (local_238._8_8_ == local_238._16_8_) {
                        bVar15 = true;
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)local_238,
                                   (iterator)local_238._8_8_,(int *)(p_Var24 + 1));
                      }
                      else {
                        *(_Rb_tree_color *)local_238._8_8_ = p_Var24[1]._M_color;
                        local_238._8_8_ = local_238._8_8_ + 4;
                        bVar15 = true;
                      }
                    }
                    p_Var11 = (_Base_ptr)puVar32;
                  } while (!(bool)(bVar34 | (_Base_ptr)puVar32 == p_Var6));
                }
                p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
              } while (p_Var24 != local_130);
              pcVar30 = (cmMakefile *)local_238._0_8_;
              pcVar27 = (cmMakefile *)local_238._8_8_;
              if (!bVar15) goto LAB_004e4766;
            }
            for (; pcVar30 != pcVar27;
                pcVar30 = (cmMakefile *)
                          ((long)&(pcVar30->FindPackageRootPathStack).
                                  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map + 4)) {
              iVar16 = *(int *)&(pcVar30->FindPackageRootPathStack).
                                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_map;
              local_d0._M_allocated_capacity._0_4_ = iVar16;
              if ((int)local_26c < 0) {
                iVar10._M_current =
                     (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_98,iVar10,
                             (int *)local_d0._M_local_buf);
                  p_Var24 = local_58._M_left;
                }
                else {
                  *iVar10._M_current = iVar16;
                  (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                  p_Var24 = local_58._M_left;
                }
              }
              else {
                pcVar9 = (this->EntryConstraintGraph).
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                         super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                local_158._M_dataplus._M_p = local_158._M_dataplus._M_p & 0xffffffffffffff00;
                local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
                local_268._0_8_ = (cmMakefile *)0x0;
                local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                          ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_268);
                std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
                emplace_back<int&,bool,bool,cmListFileBacktrace>
                          ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar9 + local_138),
                           (int *)local_d0._M_local_buf,(bool *)&local_158,(bool *)local_f0,
                           (cmListFileBacktrace *)local_268);
                p_Var24 = local_58._M_left;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
                  p_Var24 = local_58._M_left;
                }
              }
              for (; p_Var24 != &local_58;
                  p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
                pLVar25 = (this->EntryList).
                          super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((pLVar25[(int)local_d0._0_4_].Target == (cmGeneratorTarget *)0x0) &&
                    (1 < pLVar25[(int)local_d0._0_4_].Kind - Flag)) &&
                   (local_288 != p_Var24[1]._M_color)) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&p_Var24[1]._M_parent,(int *)local_d0._M_local_buf);
                }
              }
              if ((this->InferredDependSets).
                  super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)local_d0._0_4_].Initialized !=
                  false) {
                std::
                map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                ::operator[]((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                              *)(local_68 + 8),(key_type *)local_d0._M_local_buf);
              }
            }
            if ((cmMakefile *)local_238._0_8_ != (cmMakefile *)0x0) {
              uVar26 = local_238._16_8_ - local_238._0_8_;
              pcVar27 = (cmMakefile *)local_238._0_8_;
              goto LAB_004e492f;
            }
          }
        }
      }
LAB_004e495d:
      this_01 = local_278 + 1;
      p_Var24 = local_58._M_left;
    } while (this_01 != (pointer)local_68._0_8_);
  }
  for (; p_Var24 != &local_58; p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
    std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
    push_back(&(this->InferredDependSets).
               super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)p_Var24[1]._M_color].
               super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ,(value_type *)&p_Var24[1]._M_parent);
  }
  if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
  }
  if ((cmGlobalGenerator *)local_128._M_p != (cmGlobalGenerator *)local_118) {
    operator_delete(local_128._M_p,(ulong)(local_118._0_8_ + 1));
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
               *)(local_68 + 8));
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(int depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;
  std::string feature = LinkEntry::DEFAULT;

  bool inGroup = false;
  std::pair<int, bool> groupIndex{ -1, false };
  std::vector<int> groupItems;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LL_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      feature = ExtractFeature(item.AsStr());
      // emit a warning if an undefined feature is used as part of
      // an imported target
      if (depender_index >= 0) {
        const auto& depender = this->EntryList[depender_index];
        if (depender.Target != nullptr && depender.Target->IsImported() &&
            !IsFeatureSupported(this->Makefile, this->LinkLanguage, feature)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_ERROR,
            cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                     "' uses the generator-expression '$<LINK_LIBRARY>' with "
                     "the feature '",
                     feature,
                     "', which is undefined or unsupported.\nDid you miss to "
                     "define it by setting variables \"CMAKE_",
                     this->LinkLanguage, "_LINK_LIBRARY_USING_", feature,
                     "\" and \"CMAKE_", this->LinkLanguage,
                     "_LINK_LIBRARY_USING_", feature, "_SUPPORTED\"?"),
            this->Target->GetBacktrace());
        }
      }
      continue;
    }
    if (cmHasPrefix(item.AsStr(), LL_END) && cmHasSuffix(item.AsStr(), '>')) {
      feature = LinkEntry::DEFAULT;
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LG_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      groupIndex = this->AddLinkEntry(item);
      if (groupIndex.second) {
        LinkEntry& entry = this->EntryList[groupIndex.first];
        entry.Feature = ExtractGroupFeature(item.AsStr());
      }
      inGroup = true;
      if (depender_index >= 0) {
        this->EntryConstraintGraph[depender_index].emplace_back(
          groupIndex.first, false, false, cmListFileBacktrace());
      } else {
        // This is a direct dependency of the target being linked.
        this->OriginalEntries.push_back(groupIndex.first);
      }
      continue;
    }

    int dependee_index;

    if (cmHasPrefix(item.AsStr(), LG_END) && cmHasSuffix(item.AsStr(), '>')) {
      dependee_index = groupIndex.first;
      if (groupIndex.second) {
        this->GroupItems.emplace(groupIndex.first, groupItems);
      }
      inGroup = false;
      groupIndex = std::make_pair(-1, false);
      groupItems.clear();
      continue;
    }

    if (depender_index >= 0 && inGroup) {
      const auto& depender = this->EntryList[depender_index];
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsGroupFeatureSupported(this->Makefile, this->LinkLanguage,
                                   groupFeature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_GROUP>' with "
                   "the feature '",
                   groupFeature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_GROUP_USING_", groupFeature,
                   "\" and \"CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_",
                   groupFeature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    // Add a link entry for this item.
    auto ale = this->AddLinkEntry(item, groupIndex.first);
    dependee_index = ale.first;
    LinkEntry& entry = this->EntryList[dependee_index];
    auto const& itemFeature =
      this->GetCurrentFeature(entry.Item.Value, feature);
    if (inGroup && ale.second && entry.Target != nullptr &&
        (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY ||
         entry.Target->GetType() ==
           cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      this->CMakeInstance->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          "The feature '", groupFeature,
          "', specified as part of a generator-expression "
          "'$",
          LG_BEGIN, groupFeature, ">', will not be applied to the ",
          (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY
             ? "OBJECT"
             : "INTERFACE"),
          " library '", entry.Item.Value, "'."),
        this->Target->GetBacktrace());
    }
    if (itemFeature != LinkEntry::DEFAULT) {
      if (ale.second) {
        // current item not yet defined
        if (entry.Target != nullptr &&
            (entry.Target->GetType() ==
               cmStateEnums::TargetType::OBJECT_LIBRARY ||
             entry.Target->GetType() ==
               cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("The feature '", feature,
                     "', specified as part of a generator-expression "
                     "'$",
                     LL_BEGIN, feature, ">', will not be applied to the ",
                     (entry.Target->GetType() ==
                          cmStateEnums::TargetType::OBJECT_LIBRARY
                        ? "OBJECT"
                        : "INTERFACE"),
                     " library '", entry.Item.Value, "'."),
            this->Target->GetBacktrace());
        } else {
          entry.Feature = itemFeature;
        }
      }
    }

    bool supportedItem = entry.Target == nullptr ||
      (entry.Target->GetType() != cmStateEnums::TargetType::OBJECT_LIBRARY &&
       entry.Target->GetType() != cmStateEnums::TargetType::INTERFACE_LIBRARY);

    if (supportedItem) {
      if (inGroup) {
        const auto& currentFeature = this->EntryList[groupIndex.first].Feature;
        for (const auto& g : this->GroupItems) {
          const auto& groupFeature = this->EntryList[g.first].Feature;
          if (groupFeature == currentFeature) {
            continue;
          }
          if (std::find(g.second.cbegin(), g.second.cend(), dependee_index) !=
              g.second.cend()) {
            this->CMakeInstance->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("Impossible to link target '", this->Target->GetName(),
                       "' because the link item '", entry.Item.Value,
                       "', specified with the group feature '", currentFeature,
                       '\'', ", has already occurred with the feature '",
                       groupFeature, '\'', ", which is not allowed."),
              this->Target->GetBacktrace());
            continue;
          }
        }
      }
      if (entry.Feature != itemFeature) {
        // incompatibles features occurred
        this->CMakeInstance->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Impossible to link target '", this->Target->GetName(),
                   "' because the link item '", entry.Item.Value,
                   "', specified ",
                   (itemFeature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", itemFeature, '\'')),
                   ", has already occurred ",
                   (entry.Feature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", entry.Feature, '\'')),
                   ", which is not allowed."),
          this->Target->GetBacktrace());
      }
    }

    if (inGroup) {
      // store item index for dependencies handling
      groupItems.push_back(dependee_index);
    } else {
      std::vector<int> indexes;
      bool entryHandled = false;
      // search any occurrence of the library in already defined groups
      for (const auto& group : this->GroupItems) {
        for (auto index : group.second) {
          if (entry.Item.Value == this->EntryList[index].Item.Value) {
            indexes.push_back(group.first);
            entryHandled = true;
            break;
          }
        }
      }
      if (!entryHandled) {
        indexes.push_back(dependee_index);
      }

      for (auto index : indexes) {
        // The dependee must come after the depender.
        if (depender_index >= 0) {
          this->EntryConstraintGraph[depender_index].emplace_back(
            index, false, false, cmListFileBacktrace());
        } else {
          // This is a direct dependency of the target being linked.
          this->OriginalEntries.push_back(index);
        }

        // Update the inferred dependencies for earlier items.
        for (auto& dependSet : dependSets) {
          // Add this item to the inferred dependencies of other items.
          // Target items are never inferred dependees because unknown
          // items are outside libraries that should not be depending on
          // targets.
          if (!this->EntryList[index].Target &&
              this->EntryList[index].Kind != LinkEntry::Flag &&
              this->EntryList[index].Kind != LinkEntry::Group &&
              dependee_index != dependSet.first) {
            dependSet.second.insert(index);
          }
        }

        // If this item needs to have dependencies inferred, do so.
        if (this->InferredDependSets[index].Initialized) {
          // Make sure an entry exists to hold the set for the item.
          dependSets[index];
        }
      }
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first].push_back(dependSet.second);
  }
}